

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Validator.cpp
# Opt level: O0

void __thiscall
arangodb::velocypack::Validator::validateCompactArray(Validator *this,uint8_t *ptr,size_t length)

{
  ValueLength VVar1;
  undefined8 uVar2;
  uint8_t *puVar3;
  char *msg;
  ulong in_RDX;
  long in_RSI;
  Exception *in_RDI;
  uint8_t *e;
  ValueLength nrItems;
  uint8_t *data;
  ValueLength byteSize;
  uint8_t *p;
  undefined8 in_stack_ffffffffffffff98;
  SliceBase<arangodb::velocypack::Slice,_arangodb::velocypack::Slice> *in_stack_ffffffffffffffa0;
  size_t in_stack_ffffffffffffffa8;
  ExceptionType EVar4;
  Slice in_stack_ffffffffffffffb8;
  uint8_t **in_stack_ffffffffffffffc0;
  ValueLength local_38;
  uint8_t *local_20;
  
  validateBufferLength
            ((Validator *)in_RDI,in_stack_ffffffffffffffa8,(size_t)in_stack_ffffffffffffffa0,
             SUB81((ulong)in_stack_ffffffffffffff98 >> 0x38,0));
  local_20 = (uint8_t *)(in_RSI + 1);
  VVar1 = ReadVariableLengthValue<false>(in_stack_ffffffffffffffc0,in_stack_ffffffffffffffb8._start)
  ;
  if ((VVar1 <= in_RDX) && (3 < VVar1)) {
    puVar3 = (uint8_t *)(in_RSI + VVar1);
    local_38 = ReadVariableLengthValue<true>
                         (in_stack_ffffffffffffffc0,in_stack_ffffffffffffffb8._start);
    EVar4 = (ExceptionType)(in_stack_ffffffffffffffa8 >> 0x20);
    if (local_38 == 0) {
      msg = (char *)__cxa_allocate_exception(0x18);
      Exception::Exception(in_RDI,EVar4,msg);
      __cxa_throw(msg,&Exception::typeinfo,Exception::~Exception);
    }
    while( true ) {
      EVar4 = (ExceptionType)(in_stack_ffffffffffffffa8 >> 0x20);
      if (local_38 == 0) {
        return;
      }
      if (puVar3 <= local_20) break;
      validatePart((Validator *)length,p,byteSize,data._7_1_);
      Slice::Slice((Slice *)&stack0xffffffffffffffb8,local_20);
      VVar1 = SliceBase<arangodb::velocypack::Slice,_arangodb::velocypack::Slice>::byteSize
                        (in_stack_ffffffffffffffa0);
      local_20 = local_20 + VVar1;
      local_38 = local_38 - 1;
    }
    uVar2 = __cxa_allocate_exception(0x18);
    Exception::Exception(in_RDI,EVar4,(char *)in_stack_ffffffffffffffa0);
    __cxa_throw(uVar2,&Exception::typeinfo,Exception::~Exception);
  }
  uVar2 = __cxa_allocate_exception(0x18);
  Exception::Exception
            (in_RDI,(ExceptionType)((ulong)uVar2 >> 0x20),(char *)in_stack_ffffffffffffffa0);
  __cxa_throw(uVar2,&Exception::typeinfo,Exception::~Exception);
}

Assistant:

void Validator::validateCompactArray(uint8_t const* ptr, std::size_t length) {
  // compact Array without index table
  validateBufferLength(4, length, true);

  uint8_t const* p = ptr + 1;
  // read byteLength
  ValueLength const byteSize = ReadVariableLengthValue<false>(p, p + length);
  if (byteSize > length || byteSize < 4) {
    throw Exception(Exception::ValidatorInvalidLength,
                    "Array length value is out of bounds");
  }

  // read nrItems
  uint8_t const* data = p;
  p = ptr + byteSize - 1;
  ValueLength nrItems = ReadVariableLengthValue<true>(p, ptr + byteSize);
  if (nrItems == 0) {
    throw Exception(Exception::ValidatorInvalidLength,
                    "Array length value is out of bounds");
  }
  ++p;

  // validate the array members
  uint8_t const* e = p;
  p = data;
  while (nrItems-- > 0) {
    if (p >= e) {
      throw Exception(Exception::ValidatorInvalidLength,
                      "Array items number is out of bounds");
    }
    validatePart(p, e - p, true);
    p += Slice(p).byteSize();
  }
}